

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::AsyncTimeCoordinator::transmitTimingMessagesDownstream
          (AsyncTimeCoordinator *this,ActionMessage *msg,GlobalFederateId skipFed)

{
  bool bVar1;
  action_t aVar2;
  reference pDVar3;
  BaseType in_EDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  DependencyInfo *dep_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  TimeDependencies *__range2_1;
  DependencyInfo *dep;
  const_iterator __end2;
  const_iterator __begin2;
  TimeDependencies *__range2;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_50;
  GlobalFederateId *local_48;
  BaseType local_3c;
  reference local_38;
  DependencyInfo *local_30;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_28;
  GlobalFederateId *local_20;
  ActionMessage *local_18;
  GlobalFederateId local_4;
  
  local_18 = in_RSI;
  local_4.gid = in_EDX;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_helics::ActionMessage_&)> *)in_RDI);
  if (bVar1) {
    aVar2 = ActionMessage::action(local_18);
    if ((aVar2 == cmd_time_request) ||
       (aVar2 = ActionMessage::action(local_18), aVar2 == cmd_time_grant)) {
      local_20 = &in_RDI->source_id;
      local_28._M_current =
           (DependencyInfo *)
           TimeDependencies::begin
                     ((TimeDependencies *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_30 = (DependencyInfo *)
                 TimeDependencies::end
                           ((TimeDependencies *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_RDI,
                                (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        local_38 = __gnu_cxx::
                   __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator*(&local_28);
        if ((local_38->connection == CHILD) && ((local_38->dependent & 1U) != 0)) {
          local_3c = local_4.gid;
          bVar1 = GlobalFederateId::operator==(&local_38->fedID,local_4);
          if ((!bVar1) &&
             (((local_38->dependency & 1U) == 0 ||
              (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                                 ((TimeRepresentation<count_time<9,_long>_> *)local_38,
                                  &local_18->actionTime), !bVar1)))) {
            (local_18->dest_id).gid = (local_38->fedID).gid;
            std::function<void_(const_helics::ActionMessage_&)>::operator()
                      ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,
                       (ActionMessage *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          }
        }
        __gnu_cxx::
        __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(&local_28);
      }
    }
    else {
      local_48 = &in_RDI->source_id;
      local_50._M_current =
           (DependencyInfo *)
           TimeDependencies::begin
                     ((TimeDependencies *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      TimeDependencies::end
                ((TimeDependencies *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_RDI,
                                (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar3 = __gnu_cxx::
                 __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator*(&local_50);
        if (((pDVar3->dependent & 1U) != 0) &&
           (bVar1 = GlobalFederateId::operator==(&pDVar3->fedID,local_4), !bVar1)) {
          aVar2 = ActionMessage::action(local_18);
          if (aVar2 == cmd_exec_request) {
            ActionMessage::setExtraDestData(in_RDI,in_stack_ffffffffffffff8c);
          }
          (local_18->dest_id).gid = (pDVar3->fedID).gid;
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,
                     (ActionMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
          ;
        }
        __gnu_cxx::
        __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(&local_50);
      }
    }
  }
  return;
}

Assistant:

void AsyncTimeCoordinator::transmitTimingMessagesDownstream(ActionMessage& msg,
                                                            GlobalFederateId skipFed) const
{
    if (!sendMessageFunction) {
        return;
    }
    if ((msg.action() == CMD_TIME_REQUEST || msg.action() == CMD_TIME_GRANT)) {
        for (const auto& dep : dependencies) {
            if (dep.connection != ConnectionType::CHILD) {
                continue;
            }
            if (!dep.dependent) {
                continue;
            }
            if (dep.fedID == skipFed) {
                continue;
            }
            if (dep.dependency) {
                if (dep.next > msg.actionTime) {
                    continue;
                }
            }
            msg.dest_id = dep.fedID;
            sendMessageFunction(msg);
        }
    } else {
        for (const auto& dep : dependencies) {
            if (dep.dependent) {
                if (dep.fedID == skipFed) {
                    continue;
                }
                if (msg.action() == CMD_EXEC_REQUEST) {
                    msg.setExtraDestData(dep.sequenceCounter);
                }
                msg.dest_id = dep.fedID;
                sendMessageFunction(msg);
            }
        }
    }
}